

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisInputPeek(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 *value)

{
  ZyanU8 *value_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderState *state_local;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xf9,
                  "ZyanStatus ZydisInputPeek(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *)"
                 );
  }
  if (instruction != (ZydisDecodedInstruction *)0x0) {
    if (value != (ZyanU8 *)0x0) {
      if (instruction->length < 0xf) {
        if (state->buffer_len == 0) {
          state_local._4_4_ = 0x80200000;
        }
        else {
          *value = *state->buffer;
          state_local._4_4_ = 0x100000;
        }
      }
      else {
        state_local._4_4_ = 0x80200002;
      }
      return state_local._4_4_;
    }
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xfb,
                  "ZyanStatus ZydisInputPeek(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *)"
                 );
  }
  __assert_fail("instruction",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c",
                0xfa,
                "ZyanStatus ZydisInputPeek(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8 *)"
               );
}

Assistant:

static ZyanStatus ZydisInputPeek(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8* value)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(value);

    if (instruction->length >= ZYDIS_MAX_INSTRUCTION_LENGTH)
    {
        return ZYDIS_STATUS_INSTRUCTION_TOO_LONG;
    }

    if (state->buffer_len > 0)
    {
        *value = state->buffer[0];
        return ZYAN_STATUS_SUCCESS;
    }

    return ZYDIS_STATUS_NO_MORE_DATA;
}